

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

void rtcSetGeometryBuffer
               (RTCGeometry hgeometry,RTCBufferType type,uint slot,RTCFormat format,
               RTCBuffer hbuffer,size_t byteOffset,size_t byteStride,size_t itemCount)

{
  undefined8 *puVar1;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  Ref<embree::Buffer> buffer;
  DeviceEnterLeave enterleave;
  
  buffer.ptr = (Buffer *)hbuffer;
  if (hbuffer == (RTCBuffer)0x0) {
    if (hgeometry != (RTCGeometry)0x0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid argument","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_60,local_60 + local_58)
      ;
      __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
    }
  }
  else {
    (**(code **)(*(long *)hbuffer + 0x10))(hbuffer);
    if (hgeometry != (RTCGeometry)0x0) {
      embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hgeometry);
      if (*(Device **)(hgeometry + 0x10) != (buffer.ptr)->device) {
        puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"inputs are from different devices","");
        *puVar1 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar1 + 1) = 2;
        puVar1[2] = puVar1 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar1 + 2),local_60,local_60 + local_58);
        __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
      }
      if (itemCount >> 0x20 == 0) {
        (**(code **)(*(long *)hgeometry + 0xf8))
                  (hgeometry,type,slot,format,&buffer,byteOffset,byteStride,itemCount);
        embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
        if (buffer.ptr != (Buffer *)0x0) {
          (*((buffer.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        return;
      }
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"buffer too large","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_60,local_60 + local_58)
      ;
      __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
    }
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid argument","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_60,local_60 + local_58);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetGeometryBuffer(RTCGeometry hgeometry, RTCBufferType type, unsigned int slot, RTCFormat format, RTCBuffer hbuffer, size_t byteOffset, size_t byteStride, size_t itemCount)
  {
    Geometry* geometry = (Geometry*) hgeometry;
    Ref<Buffer> buffer = (Buffer*)hbuffer;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetGeometryBuffer);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_VERIFY_HANDLE(hbuffer);
    RTC_ENTER_DEVICE(hgeometry);
    
    if (geometry->device != buffer->device)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"inputs are from different devices");
    
    if (itemCount > 0xFFFFFFFFu)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"buffer too large");
    
    geometry->setBuffer(type, slot, format, buffer, byteOffset, byteStride, (unsigned int)itemCount);
    RTC_CATCH_END2(geometry);
  }